

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void percent_rankStepFunc(sqlite3_context *pCtx,int nArg,sqlite3_value **apArg)

{
  void *pvVar1;
  
  pvVar1 = sqlite3_aggregate_context(pCtx,0x18);
  if (pvVar1 != (void *)0x0) {
    *(long *)((long)pvVar1 + 0x10) = *(long *)((long)pvVar1 + 0x10) + 1;
  }
  return;
}

Assistant:

static void percent_rankStepFunc(
  sqlite3_context *pCtx, 
  int nArg,
  sqlite3_value **apArg
){
  struct CallCount *p;
  UNUSED_PARAMETER(nArg); assert( nArg==0 );
  UNUSED_PARAMETER(apArg);
  p = (struct CallCount*)sqlite3_aggregate_context(pCtx, sizeof(*p));
  if( p ){
    p->nTotal++;
  }
}